

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

int Nwk_ManMinimumBaseInt(Nwk_Man_t *pNtk,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p;
  Nwk_Obj_t *pObj;
  uint uVar2;
  int i;
  
  p = Vec_IntAlloc(0x10000);
  uVar2 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,i);
    if ((pObj != (Nwk_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x20 & 7) == 3)) {
      iVar1 = Nwk_ManMinimumBaseNode(pObj,p,fVerbose);
      uVar2 = uVar2 + iVar1;
    }
  }
  if ((fVerbose != 0) && (uVar2 != 0)) {
    printf("Support minimization reduced support of %d nodes.\n",(ulong)uVar2);
  }
  Vec_IntFree(p);
  return uVar2;
}

Assistant:

int Nwk_ManMinimumBaseInt( Nwk_Man_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTruth;
    Nwk_Obj_t * pObj;
    int i, Counter = 0;
    vTruth = Vec_IntAlloc( 1 << 16 );
    Nwk_ManForEachNode( pNtk, pObj, i )
        Counter += Nwk_ManMinimumBaseNode( pObj, vTruth, fVerbose );
    if ( fVerbose && Counter )
        printf( "Support minimization reduced support of %d nodes.\n", Counter );
    Vec_IntFree( vTruth );
    return Counter;
}